

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

void __thiscall
Am_Drawonable_Impl::Get_String_Extents
          (Am_Drawonable_Impl *this,Am_Font *Am_font,char *the_string,int the_string_length,
          int *width,int *ascent,int *descent,int *left_bearing,int *right_bearing)

{
  uint *puVar1;
  int iVar2;
  Am_Font_Data *pAVar3;
  XFontStruct *pXVar4;
  int the_direction;
  XCharStruct the_overall;
  undefined1 local_48 [4];
  short local_44;
  short local_42;
  short local_40;
  int *local_38;
  
  pAVar3 = Am_font->data;
  if (pAVar3 != (Am_Font_Data *)0x0) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  local_38 = width;
  pAVar3 = Am_Font_Data::Narrow(&pAVar3->super_Am_Wrapper);
  if (pAVar3 == (Am_Font_Data *)0x0) {
    *local_38 = 0;
    *ascent = 0;
    *descent = 0;
    *left_bearing = 0;
    *right_bearing = 0;
  }
  else {
    if (pAVar3->family - Am_FONT_JFIXED < 4) {
      iVar2 = unwrap_j(the_string,the_string_length);
      pXVar4 = Am_Font_Data::Get_X_Font(pAVar3,this);
      XTextExtents16(pXVar4,buf16,iVar2,local_48,ascent,descent,&local_44);
    }
    else {
      pXVar4 = Am_Font_Data::Get_X_Font(pAVar3,this);
      XTextExtents(pXVar4,the_string,the_string_length,local_48,ascent,descent,&local_44);
    }
    *local_38 = (int)local_40;
    *left_bearing = (int)local_44;
    *right_bearing = (int)local_42;
    Am_Wrapper::Release(&pAVar3->super_Am_Wrapper);
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_String_Extents(const Am_Font &Am_font,
                                       const char *the_string,
                                       int the_string_length, int &width,
                                       int &ascent, int &descent,
                                       int &left_bearing, int &right_bearing)
{
  int the_direction;
  XCharStruct the_overall;

  Am_Font_Data *font = Am_Font_Data::Narrow(Am_font);

  if (font) {
    Am_Font_Family_Flag family;
    bool is_bold, is_italic, is_underline;
    Am_Font_Size_Flag size;
    font->Get_Values(family, is_bold, is_italic, is_underline, size);
    if (family == Am_FONT_JFIXED || family == Am_FONT_JPROPORTIONAL ||
        family == Am_FONT_KFIXED || family == Am_FONT_CFIXED) {
      the_string_length = unwrap_j(the_string, the_string_length);
      XTextExtents16(font->Get_X_Font(this), buf16, the_string_length,
                     &the_direction, &ascent, &descent, &the_overall);
    } else
      XTextExtents(font->Get_X_Font(this), the_string, the_string_length,
                   &the_direction, &ascent, &descent, &the_overall);
    width = the_overall.width;
    left_bearing = the_overall.lbearing;
    right_bearing = the_overall.rbearing;
    font->Release();
  } else {
    width = 0;
    ascent = 0;
    descent = 0;
    left_bearing = 0;
    right_bearing = 0;
  }
}